

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O2

void update_explode(void)

{
  EXPLOSION *pEVar1;
  float fVar2;
  EXPLOSION **ppEVar3;
  EXPLOSION *__ptr;
  
  ppEVar3 = &explosions;
  __ptr = explosions;
  while (__ptr != (EXPLOSION *)0x0) {
    fVar2 = __ptr->time + 1.0 / ((float)__ptr->big * 0.5 + 1.0);
    __ptr->time = fVar2;
    pEVar1 = __ptr->next;
    if (fVar2 <= 32.0) {
      ppEVar3 = &__ptr->next;
      __ptr = pEVar1;
    }
    else {
      *ppEVar3 = pEVar1;
      free(__ptr);
      __ptr = pEVar1;
    }
  }
  return;
}

Assistant:

void update_explode()
{
   EXPLOSION **p = &explosions;
   EXPLOSION *e = explosions;
   EXPLOSION *tmp;

   while (e) {
      e->time += 1.0 / (e->big/2.0 + 1);

      if (e->time > 32) {
	 *p = e->next;
	 tmp = e;
	 e = e->next;
	 free(tmp);
      }
      else {
	 p = &e->next;
	 e = e->next;
      }
   }
}